

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O3

Matrix<double,_3,_1,_0,_3,_1> * __thiscall
cp::interpolation<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::inter5
          (Matrix<double,_3,_1,_0,_3,_1> *__return_storage_ptr__,
          interpolation<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ActualDstType actualDst;
  double dVar10;
  
  dVar10 = t * t;
  dVar1 = pow(t,3.0);
  dVar2 = pow(t,4.0);
  dVar3 = pow(t,5.0);
  dVar4 = this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar5 = this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar6 = this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar7 = this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar8 = this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar9 = this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] =
       dVar3 * this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] +
       dVar2 * this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] +
       dVar1 * this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] +
       dVar10 * this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] +
       this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[0] * t +
       this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[0];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] =
       dVar3 * dVar9 + dVar2 * dVar8 + dVar1 * dVar7 + dVar10 * dVar6 + dVar5 * t + dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] =
       dVar3 * this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] +
       dVar2 * this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] +
       dVar1 * this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] +
       dVar10 * this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] +
       t * this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] +
       this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[2];
  return __return_storage_ptr__;
}

Assistant:

T interpolation<T>::inter5(double t) {
    return (a[0] + a[1]*t + a[2]*pow(t, 2) + a[3]*pow(t, 3) + a[4]*pow(t, 4) + a[5]*pow(t, 5));
}